

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 (*pauVar7) [16];
  int iVar8;
  uint uVar9;
  undefined4 uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [32];
  undefined1 auVar39 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  float fVar83;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar97;
  float fVar98;
  undefined1 auVar96 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a9;
  ulong local_13a8;
  undefined8 local_13a0;
  float fStack_1398;
  float fStack_1394;
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  Scene *local_1340;
  undefined8 uStack_1338;
  undefined1 local_1330 [16];
  ulong local_1318;
  size_t local_1310;
  RayHitK<8> *local_1308;
  long local_1300;
  ulong local_12f8;
  RTCFilterFunctionNArguments local_12f0;
  undefined1 local_12c0 [16];
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  undefined1 *local_1280;
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [32];
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float local_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float local_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar20 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar10 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1160._4_4_ = uVar10;
  local_1160._0_4_ = uVar10;
  local_1160._8_4_ = uVar10;
  local_1160._12_4_ = uVar10;
  auVar79 = ZEXT1664(local_1160);
  uVar10 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1170._4_4_ = uVar10;
  local_1170._0_4_ = uVar10;
  local_1170._8_4_ = uVar10;
  local_1170._12_4_ = uVar10;
  auVar80 = ZEXT1664(local_1170);
  uVar10 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1180._4_4_ = uVar10;
  local_1180._0_4_ = uVar10;
  local_1180._8_4_ = uVar10;
  local_1180._12_4_ = uVar10;
  auVar82 = ZEXT1664(local_1180);
  fVar95 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar99 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar107 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar83 = fVar95 * 0.99999964;
  fVar90 = fVar99 * 0.99999964;
  fVar94 = fVar107 * 0.99999964;
  fVar95 = fVar95 * 1.0000004;
  fVar99 = fVar99 * 1.0000004;
  fVar107 = fVar107 * 1.0000004;
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_12f8 = uVar18 ^ 0x10;
  uVar19 = uVar17 ^ 0x10;
  iVar8 = (tray->tnear).field_0.i[k];
  local_12c0._4_4_ = iVar8;
  local_12c0._0_4_ = iVar8;
  local_12c0._8_4_ = iVar8;
  local_12c0._12_4_ = iVar8;
  auVar74 = ZEXT1664(local_12c0);
  iVar8 = (tray->tfar).field_0.i[k];
  auVar30 = ZEXT1664(CONCAT412(iVar8,CONCAT48(iVar8,CONCAT44(iVar8,iVar8))));
  iVar8 = 1 << ((uint)k & 0x1f);
  auVar40._4_4_ = iVar8;
  auVar40._0_4_ = iVar8;
  auVar40._8_4_ = iVar8;
  auVar40._12_4_ = iVar8;
  auVar40._16_4_ = iVar8;
  auVar40._20_4_ = iVar8;
  auVar40._24_4_ = iVar8;
  auVar40._28_4_ = iVar8;
  auVar6 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar40 = vpand_avx2(auVar40,auVar6);
  local_10e0 = vpcmpeqd_avx2(auVar40,auVar6);
  local_1190 = fVar83;
  fStack_118c = fVar83;
  fStack_1188 = fVar83;
  fStack_1184 = fVar83;
  local_11a0 = fVar90;
  fStack_119c = fVar90;
  fStack_1198 = fVar90;
  fStack_1194 = fVar90;
  local_11b0 = fVar94;
  fStack_11ac = fVar94;
  fStack_11a8 = fVar94;
  fStack_11a4 = fVar94;
  local_11c0 = fVar95;
  fStack_11bc = fVar95;
  fStack_11b8 = fVar95;
  fStack_11b4 = fVar95;
  local_11d0 = fVar99;
  fStack_11cc = fVar99;
  fStack_11c8 = fVar99;
  fStack_11c4 = fVar99;
  local_11e0 = fVar107;
  fStack_11dc = fVar107;
  fStack_11d8 = fVar107;
  fStack_11d4 = fVar107;
  fVar87 = fVar83;
  fVar88 = fVar83;
  fVar89 = fVar83;
  fVar91 = fVar90;
  fVar92 = fVar90;
  fVar93 = fVar90;
  fVar100 = fVar94;
  fVar102 = fVar94;
  fVar104 = fVar94;
  fVar106 = fVar95;
  fVar97 = fVar95;
  fVar98 = fVar95;
  fVar101 = fVar99;
  fVar103 = fVar99;
  fVar105 = fVar99;
  fVar108 = fVar107;
  fVar109 = fVar107;
  fVar110 = fVar107;
  local_13a8 = uVar17;
  local_1318 = uVar18;
  local_1310 = k;
  local_1308 = ray;
LAB_015e6ae4:
  do {
    do {
      if (pauVar20 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar7 = pauVar20 + -1;
      pauVar20 = pauVar20 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar7 + 8));
    uVar22 = *(ulong *)*pauVar20;
    while ((uVar22 & 8) == 0) {
      auVar32 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar18),auVar79._0_16_);
      auVar31._0_4_ = fVar83 * auVar32._0_4_;
      auVar31._4_4_ = fVar87 * auVar32._4_4_;
      auVar31._8_4_ = fVar88 * auVar32._8_4_;
      auVar31._12_4_ = fVar89 * auVar32._12_4_;
      auVar32 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar17),auVar80._0_16_);
      auVar42._0_4_ = fVar90 * auVar32._0_4_;
      auVar42._4_4_ = fVar91 * auVar32._4_4_;
      auVar42._8_4_ = fVar92 * auVar32._8_4_;
      auVar42._12_4_ = fVar93 * auVar32._12_4_;
      auVar32 = vmaxps_avx(auVar31,auVar42);
      auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar15),auVar82._0_16_);
      auVar43._0_4_ = fVar94 * auVar31._0_4_;
      auVar43._4_4_ = fVar100 * auVar31._4_4_;
      auVar43._8_4_ = fVar102 * auVar31._8_4_;
      auVar43._12_4_ = fVar104 * auVar31._12_4_;
      auVar31 = vmaxps_avx(auVar43,auVar74._0_16_);
      auVar31 = vmaxps_avx(auVar32,auVar31);
      auVar32 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + local_12f8),auVar79._0_16_);
      auVar44._0_4_ = fVar95 * auVar32._0_4_;
      auVar44._4_4_ = fVar106 * auVar32._4_4_;
      auVar44._8_4_ = fVar97 * auVar32._8_4_;
      auVar44._12_4_ = fVar98 * auVar32._12_4_;
      auVar32 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar19),auVar80._0_16_);
      auVar52._0_4_ = fVar99 * auVar32._0_4_;
      auVar52._4_4_ = fVar101 * auVar32._4_4_;
      auVar52._8_4_ = fVar103 * auVar32._8_4_;
      auVar52._12_4_ = fVar105 * auVar32._12_4_;
      auVar32 = vminps_avx(auVar44,auVar52);
      auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + (uVar15 ^ 0x10)),auVar82._0_16_);
      auVar53._0_4_ = fVar107 * auVar42._0_4_;
      auVar53._4_4_ = fVar108 * auVar42._4_4_;
      auVar53._8_4_ = fVar109 * auVar42._8_4_;
      auVar53._12_4_ = fVar110 * auVar42._12_4_;
      auVar42 = vminps_avx(auVar53,auVar30._0_16_);
      auVar32 = vminps_avx(auVar32,auVar42);
      auVar32 = vcmpps_avx(auVar31,auVar32,2);
      uVar9 = vmovmskps_avx(auVar32);
      local_10c0[0] = (RTCHitN)auVar31[0];
      local_10c0[1] = (RTCHitN)auVar31[1];
      local_10c0[2] = (RTCHitN)auVar31[2];
      local_10c0[3] = (RTCHitN)auVar31[3];
      local_10c0[4] = (RTCHitN)auVar31[4];
      local_10c0[5] = (RTCHitN)auVar31[5];
      local_10c0[6] = (RTCHitN)auVar31[6];
      local_10c0[7] = (RTCHitN)auVar31[7];
      local_10c0[8] = (RTCHitN)auVar31[8];
      local_10c0[9] = (RTCHitN)auVar31[9];
      local_10c0[10] = (RTCHitN)auVar31[10];
      local_10c0[0xb] = (RTCHitN)auVar31[0xb];
      local_10c0[0xc] = (RTCHitN)auVar31[0xc];
      local_10c0[0xd] = (RTCHitN)auVar31[0xd];
      local_10c0[0xe] = (RTCHitN)auVar31[0xe];
      local_10c0[0xf] = (RTCHitN)auVar31[0xf];
      if (uVar9 == 0) goto LAB_015e6ae4;
      uVar9 = uVar9 & 0xff;
      uVar21 = uVar22 & 0xfffffffffffffff0;
      lVar16 = 0;
      for (uVar22 = (ulong)uVar9; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar16 = lVar16 + 1;
      }
      uVar22 = *(ulong *)(uVar21 + lVar16 * 8);
      uVar9 = uVar9 - 1 & uVar9;
      uVar11 = (ulong)uVar9;
      if (uVar9 != 0) {
        uVar2 = *(uint *)(local_10c0 + lVar16 * 4);
        lVar16 = 0;
        for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        uVar9 = uVar9 - 1 & uVar9;
        uVar12 = (ulong)uVar9;
        uVar11 = *(ulong *)(uVar21 + lVar16 * 8);
        uVar3 = *(uint *)(local_10c0 + lVar16 * 4);
        uVar17 = local_13a8;
        if (uVar9 == 0) {
          if (uVar2 < uVar3) {
            *(ulong *)*pauVar20 = uVar11;
            *(uint *)(*pauVar20 + 8) = uVar3;
            pauVar20 = pauVar20 + 1;
          }
          else {
            *(ulong *)*pauVar20 = uVar22;
            *(uint *)(*pauVar20 + 8) = uVar2;
            pauVar20 = pauVar20 + 1;
            uVar22 = uVar11;
          }
        }
        else {
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar22;
          auVar32 = vpunpcklqdq_avx(auVar32,ZEXT416(uVar2));
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar11;
          auVar31 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar3));
          lVar16 = 0;
          for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          uVar9 = uVar9 - 1 & uVar9;
          uVar22 = (ulong)uVar9;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *(ulong *)(uVar21 + lVar16 * 8);
          auVar43 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_10c0 + lVar16 * 4)));
          auVar42 = vpcmpgtd_avx(auVar31,auVar32);
          if (uVar9 == 0) {
            auVar44 = vpshufd_avx(auVar42,0xaa);
            auVar42 = vblendvps_avx(auVar31,auVar32,auVar44);
            auVar32 = vblendvps_avx(auVar32,auVar31,auVar44);
            auVar31 = vpcmpgtd_avx(auVar43,auVar42);
            auVar44 = vpshufd_avx(auVar31,0xaa);
            auVar31 = vblendvps_avx(auVar43,auVar42,auVar44);
            auVar42 = vblendvps_avx(auVar42,auVar43,auVar44);
            auVar43 = vpcmpgtd_avx(auVar42,auVar32);
            auVar44 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar42,auVar32,auVar44);
            auVar32 = vblendvps_avx(auVar32,auVar42,auVar44);
            *pauVar20 = auVar32;
            pauVar20[1] = auVar43;
            uVar22 = auVar31._0_8_;
            pauVar20 = pauVar20 + 2;
          }
          else {
            lVar16 = 0;
            for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            auVar64._8_8_ = 0;
            auVar64._0_8_ = *(ulong *)(uVar21 + lVar16 * 8);
            auVar52 = vpunpcklqdq_avx(auVar64,ZEXT416(*(uint *)(local_10c0 + lVar16 * 4)));
            auVar44 = vpshufd_avx(auVar42,0xaa);
            auVar42 = vblendvps_avx(auVar31,auVar32,auVar44);
            auVar32 = vblendvps_avx(auVar32,auVar31,auVar44);
            auVar31 = vpcmpgtd_avx(auVar52,auVar43);
            auVar44 = vpshufd_avx(auVar31,0xaa);
            auVar31 = vblendvps_avx(auVar52,auVar43,auVar44);
            auVar43 = vblendvps_avx(auVar43,auVar52,auVar44);
            auVar44 = vpcmpgtd_avx(auVar43,auVar32);
            auVar52 = vpshufd_avx(auVar44,0xaa);
            auVar44 = vblendvps_avx(auVar43,auVar32,auVar52);
            auVar32 = vblendvps_avx(auVar32,auVar43,auVar52);
            auVar43 = vpcmpgtd_avx(auVar31,auVar42);
            auVar52 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar31,auVar42,auVar52);
            auVar31 = vblendvps_avx(auVar42,auVar31,auVar52);
            auVar42 = vpcmpgtd_avx(auVar44,auVar31);
            auVar52 = vpshufd_avx(auVar42,0xaa);
            auVar42 = vblendvps_avx(auVar44,auVar31,auVar52);
            auVar31 = vblendvps_avx(auVar31,auVar44,auVar52);
            *pauVar20 = auVar32;
            pauVar20[1] = auVar31;
            pauVar20[2] = auVar42;
            auVar74 = ZEXT1664(local_12c0);
            uVar22 = auVar43._0_8_;
            pauVar20 = pauVar20 + 3;
          }
        }
      }
    }
    local_1300 = (ulong)((uint)uVar22 & 0xf) - 8;
    uVar22 = uVar22 & 0xfffffffffffffff0;
    for (lVar16 = 0; lVar16 != local_1300; lVar16 = lVar16 + 1) {
      lVar13 = lVar16 * 0xb0;
      uVar10 = *(undefined4 *)(ray + k * 4);
      auVar23._4_4_ = uVar10;
      auVar23._0_4_ = uVar10;
      auVar23._8_4_ = uVar10;
      auVar23._12_4_ = uVar10;
      uVar10 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar46._4_4_ = uVar10;
      auVar46._0_4_ = uVar10;
      auVar46._8_4_ = uVar10;
      auVar46._12_4_ = uVar10;
      uVar10 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar55._4_4_ = uVar10;
      auVar55._0_4_ = uVar10;
      auVar55._8_4_ = uVar10;
      auVar55._12_4_ = uVar10;
      local_1350 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + lVar13),auVar23);
      local_1360 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x10 + lVar13),auVar46);
      auVar32 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + lVar13),auVar55);
      auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x30 + lVar13),auVar23);
      auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x40 + lVar13),auVar46);
      auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x50 + lVar13),auVar55);
      auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x60 + lVar13),auVar23);
      auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x70 + lVar13),auVar46);
      auVar53 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x80 + lVar13),auVar55);
      auVar45 = vsubps_avx(auVar44,local_1350);
      local_1100 = vsubps_avx(auVar52,local_1360);
      local_10f0 = vsubps_avx(auVar53,auVar32);
      auVar24._0_4_ = local_1350._0_4_ + auVar44._0_4_;
      auVar24._4_4_ = local_1350._4_4_ + auVar44._4_4_;
      auVar24._8_4_ = local_1350._8_4_ + auVar44._8_4_;
      auVar24._12_4_ = local_1350._12_4_ + auVar44._12_4_;
      auVar56._0_4_ = local_1360._0_4_ + auVar52._0_4_;
      auVar56._4_4_ = local_1360._4_4_ + auVar52._4_4_;
      auVar56._8_4_ = local_1360._8_4_ + auVar52._8_4_;
      auVar56._12_4_ = local_1360._12_4_ + auVar52._12_4_;
      fVar100 = auVar32._0_4_;
      auVar59._0_4_ = fVar100 + auVar53._0_4_;
      fVar102 = auVar32._4_4_;
      auVar59._4_4_ = fVar102 + auVar53._4_4_;
      fVar104 = auVar32._8_4_;
      auVar59._8_4_ = fVar104 + auVar53._8_4_;
      fVar106 = auVar32._12_4_;
      auVar59._12_4_ = fVar106 + auVar53._12_4_;
      auVar96._0_4_ = local_10f0._0_4_ * auVar56._0_4_;
      auVar96._4_4_ = local_10f0._4_4_ * auVar56._4_4_;
      auVar96._8_4_ = local_10f0._8_4_ * auVar56._8_4_;
      auVar96._12_4_ = local_10f0._12_4_ * auVar56._12_4_;
      auVar64 = vfmsub231ps_fma(auVar96,local_1100,auVar59);
      auVar60._0_4_ = auVar59._0_4_ * auVar45._0_4_;
      auVar60._4_4_ = auVar59._4_4_ * auVar45._4_4_;
      auVar60._8_4_ = auVar59._8_4_ * auVar45._8_4_;
      auVar60._12_4_ = auVar59._12_4_ * auVar45._12_4_;
      auVar54 = vfmsub231ps_fma(auVar60,local_10f0,auVar24);
      auVar25._0_4_ = local_1100._0_4_ * auVar24._0_4_;
      auVar25._4_4_ = local_1100._4_4_ * auVar24._4_4_;
      auVar25._8_4_ = local_1100._8_4_ * auVar24._8_4_;
      auVar25._12_4_ = local_1100._12_4_ * auVar24._12_4_;
      auVar23 = vfmsub231ps_fma(auVar25,auVar45,auVar56);
      local_13a0._4_4_ = *(float *)(ray + k * 4 + 0xc0);
      auVar57._0_4_ = local_13a0._4_4_ * auVar23._0_4_;
      auVar57._4_4_ = local_13a0._4_4_ * auVar23._4_4_;
      auVar57._8_4_ = local_13a0._4_4_ * auVar23._8_4_;
      auVar57._12_4_ = local_13a0._4_4_ * auVar23._12_4_;
      uVar10 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar81._4_4_ = uVar10;
      auVar81._0_4_ = uVar10;
      auVar81._8_4_ = uVar10;
      auVar81._12_4_ = uVar10;
      auVar54 = vfmadd231ps_fma(auVar57,auVar81,auVar54);
      uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
      local_1390._4_4_ = uVar10;
      local_1390._0_4_ = uVar10;
      local_1390._8_4_ = uVar10;
      local_1390._12_4_ = uVar10;
      local_1140 = vfmadd231ps_fma(auVar54,local_1390,auVar64);
      local_1110 = vsubps_avx(local_1360,auVar42);
      local_1120 = vsubps_avx(auVar32,auVar43);
      auVar65._0_4_ = auVar42._0_4_ + local_1360._0_4_;
      auVar65._4_4_ = auVar42._4_4_ + local_1360._4_4_;
      auVar65._8_4_ = auVar42._8_4_ + local_1360._8_4_;
      auVar65._12_4_ = auVar42._12_4_ + local_1360._12_4_;
      auVar61._0_4_ = fVar100 + auVar43._0_4_;
      auVar61._4_4_ = fVar102 + auVar43._4_4_;
      auVar61._8_4_ = fVar104 + auVar43._8_4_;
      auVar61._12_4_ = fVar106 + auVar43._12_4_;
      fVar95 = local_1120._0_4_;
      auVar68._0_4_ = auVar65._0_4_ * fVar95;
      fVar83 = local_1120._4_4_;
      auVar68._4_4_ = auVar65._4_4_ * fVar83;
      fVar87 = local_1120._8_4_;
      auVar68._8_4_ = auVar65._8_4_ * fVar87;
      fVar91 = local_1120._12_4_;
      auVar68._12_4_ = auVar65._12_4_ * fVar91;
      auVar54 = vfmsub231ps_fma(auVar68,local_1110,auVar61);
      local_1130 = vsubps_avx(local_1350,auVar31);
      fVar99 = local_1130._0_4_;
      auVar75._0_4_ = auVar61._0_4_ * fVar99;
      fVar90 = local_1130._4_4_;
      auVar75._4_4_ = auVar61._4_4_ * fVar90;
      fVar88 = local_1130._8_4_;
      auVar75._8_4_ = auVar61._8_4_ * fVar88;
      fVar92 = local_1130._12_4_;
      auVar75._12_4_ = auVar61._12_4_ * fVar92;
      auVar62._0_4_ = local_1350._0_4_ + auVar31._0_4_;
      auVar62._4_4_ = local_1350._4_4_ + auVar31._4_4_;
      auVar62._8_4_ = local_1350._8_4_ + auVar31._8_4_;
      auVar62._12_4_ = local_1350._12_4_ + auVar31._12_4_;
      auVar32 = vfmsub231ps_fma(auVar75,local_1120,auVar62);
      fVar107 = local_1110._0_4_;
      auVar63._0_4_ = auVar62._0_4_ * fVar107;
      fVar94 = local_1110._4_4_;
      auVar63._4_4_ = auVar62._4_4_ * fVar94;
      fVar89 = local_1110._8_4_;
      auVar63._8_4_ = auVar62._8_4_ * fVar89;
      fVar93 = local_1110._12_4_;
      auVar63._12_4_ = auVar62._12_4_ * fVar93;
      auVar64 = vfmsub231ps_fma(auVar63,local_1130,auVar65);
      auVar26._0_4_ = local_13a0._4_4_ * auVar64._0_4_;
      auVar26._4_4_ = local_13a0._4_4_ * auVar64._4_4_;
      auVar26._8_4_ = local_13a0._4_4_ * auVar64._8_4_;
      auVar26._12_4_ = local_13a0._4_4_ * auVar64._12_4_;
      auVar32 = vfmadd231ps_fma(auVar26,auVar81,auVar32);
      local_12a0 = vfmadd231ps_fma(auVar32,local_1390,auVar54);
      auVar54 = vsubps_avx(auVar31,auVar44);
      auVar69._0_4_ = auVar31._0_4_ + auVar44._0_4_;
      auVar69._4_4_ = auVar31._4_4_ + auVar44._4_4_;
      auVar69._8_4_ = auVar31._8_4_ + auVar44._8_4_;
      auVar69._12_4_ = auVar31._12_4_ + auVar44._12_4_;
      auVar44 = vsubps_avx(auVar42,auVar52);
      auVar47._0_4_ = auVar42._0_4_ + auVar52._0_4_;
      auVar47._4_4_ = auVar42._4_4_ + auVar52._4_4_;
      auVar47._8_4_ = auVar42._8_4_ + auVar52._8_4_;
      auVar47._12_4_ = auVar42._12_4_ + auVar52._12_4_;
      auVar42 = vsubps_avx(auVar43,auVar53);
      auVar33._0_4_ = auVar43._0_4_ + auVar53._0_4_;
      auVar33._4_4_ = auVar43._4_4_ + auVar53._4_4_;
      auVar33._8_4_ = auVar43._8_4_ + auVar53._8_4_;
      auVar33._12_4_ = auVar43._12_4_ + auVar53._12_4_;
      auVar66._0_4_ = auVar42._0_4_ * auVar47._0_4_;
      auVar66._4_4_ = auVar42._4_4_ * auVar47._4_4_;
      auVar66._8_4_ = auVar42._8_4_ * auVar47._8_4_;
      auVar66._12_4_ = auVar42._12_4_ * auVar47._12_4_;
      auVar31 = vfmsub231ps_fma(auVar66,auVar44,auVar33);
      auVar34._0_4_ = auVar33._0_4_ * auVar54._0_4_;
      auVar34._4_4_ = auVar33._4_4_ * auVar54._4_4_;
      auVar34._8_4_ = auVar33._8_4_ * auVar54._8_4_;
      auVar34._12_4_ = auVar33._12_4_ * auVar54._12_4_;
      auVar32 = vfmsub231ps_fma(auVar34,auVar42,auVar69);
      auVar70._0_4_ = auVar44._0_4_ * auVar69._0_4_;
      auVar70._4_4_ = auVar44._4_4_ * auVar69._4_4_;
      auVar70._8_4_ = auVar44._8_4_ * auVar69._8_4_;
      auVar70._12_4_ = auVar44._12_4_ * auVar69._12_4_;
      auVar43 = vfmsub231ps_fma(auVar70,auVar54,auVar47);
      local_13a0._0_4_ = local_13a0._4_4_;
      fStack_1398 = local_13a0._4_4_;
      fStack_1394 = local_13a0._4_4_;
      auVar48._0_4_ = local_13a0._4_4_ * auVar43._0_4_;
      auVar48._4_4_ = local_13a0._4_4_ * auVar43._4_4_;
      auVar48._8_4_ = local_13a0._4_4_ * auVar43._8_4_;
      auVar48._12_4_ = local_13a0._4_4_ * auVar43._12_4_;
      auVar32 = vfmadd231ps_fma(auVar48,auVar81,auVar32);
      auVar43 = vfmadd231ps_fma(auVar32,local_1390,auVar31);
      local_12b0 = local_1140._0_4_;
      fStack_12ac = local_1140._4_4_;
      fStack_12a8 = local_1140._8_4_;
      fStack_12a4 = local_1140._12_4_;
      local_1290._0_4_ = auVar43._0_4_ + local_12a0._0_4_ + local_12b0;
      local_1290._4_4_ = auVar43._4_4_ + local_12a0._4_4_ + fStack_12ac;
      local_1290._8_4_ = auVar43._8_4_ + local_12a0._8_4_ + fStack_12a8;
      local_1290._12_4_ = auVar43._12_4_ + local_12a0._12_4_ + fStack_12a4;
      auVar67._8_4_ = 0x7fffffff;
      auVar67._0_8_ = 0x7fffffff7fffffff;
      auVar67._12_4_ = 0x7fffffff;
      auVar32 = vminps_avx(local_1140,local_12a0);
      auVar32 = vminps_avx(auVar32,auVar43);
      local_1150 = vandps_avx(local_1290,auVar67);
      auVar76._0_4_ = local_1150._0_4_ * 1.1920929e-07;
      auVar76._4_4_ = local_1150._4_4_ * 1.1920929e-07;
      auVar76._8_4_ = local_1150._8_4_ * 1.1920929e-07;
      auVar76._12_4_ = local_1150._12_4_ * 1.1920929e-07;
      uVar21 = CONCAT44(auVar76._4_4_,auVar76._0_4_);
      auVar71._0_8_ = uVar21 ^ 0x8000000080000000;
      auVar71._8_4_ = -auVar76._8_4_;
      auVar71._12_4_ = -auVar76._12_4_;
      auVar32 = vcmpps_avx(auVar32,auVar71,5);
      auVar31 = vmaxps_avx(local_1140,local_12a0);
      auVar31 = vmaxps_avx(auVar31,auVar43);
      auVar31 = vcmpps_avx(auVar31,auVar76,2);
      auVar32 = vorps_avx(auVar32,auVar31);
      if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar32[0xf] < '\0'
         ) {
        auVar49._0_4_ = fVar107 * local_10f0._0_4_;
        auVar49._4_4_ = fVar94 * local_10f0._4_4_;
        auVar49._8_4_ = fVar89 * local_10f0._8_4_;
        auVar49._12_4_ = fVar93 * local_10f0._12_4_;
        auVar72._0_4_ = fVar99 * local_1100._0_4_;
        auVar72._4_4_ = fVar90 * local_1100._4_4_;
        auVar72._8_4_ = fVar88 * local_1100._8_4_;
        auVar72._12_4_ = fVar92 * local_1100._12_4_;
        auVar43 = vfmsub213ps_fma(local_1100,local_1120,auVar49);
        auVar77._0_4_ = auVar44._0_4_ * fVar95;
        auVar77._4_4_ = auVar44._4_4_ * fVar83;
        auVar77._8_4_ = auVar44._8_4_ * fVar87;
        auVar77._12_4_ = auVar44._12_4_ * fVar91;
        auVar35._0_4_ = fVar99 * auVar42._0_4_;
        auVar35._4_4_ = fVar90 * auVar42._4_4_;
        auVar35._8_4_ = fVar88 * auVar42._8_4_;
        auVar35._12_4_ = fVar92 * auVar42._12_4_;
        auVar52 = vfmsub213ps_fma(auVar42,local_1110,auVar77);
        auVar31 = vandps_avx(auVar49,auVar67);
        auVar42 = vandps_avx(auVar77,auVar67);
        auVar31 = vcmpps_avx(auVar31,auVar42,1);
        local_1230 = vblendvps_avx(auVar52,auVar43,auVar31);
        auVar78._0_4_ = fVar107 * auVar54._0_4_;
        auVar78._4_4_ = fVar94 * auVar54._4_4_;
        auVar78._8_4_ = fVar89 * auVar54._8_4_;
        auVar78._12_4_ = fVar93 * auVar54._12_4_;
        auVar43 = vfmsub213ps_fma(auVar54,local_1120,auVar35);
        auVar84._0_4_ = auVar45._0_4_ * fVar95;
        auVar84._4_4_ = auVar45._4_4_ * fVar83;
        auVar84._8_4_ = auVar45._8_4_ * fVar87;
        auVar84._12_4_ = auVar45._12_4_ * fVar91;
        auVar52 = vfmsub213ps_fma(local_10f0,local_1130,auVar84);
        auVar31 = vandps_avx(auVar84,auVar67);
        auVar42 = vandps_avx(auVar35,auVar67);
        auVar31 = vcmpps_avx(auVar31,auVar42,1);
        local_1220 = vblendvps_avx(auVar43,auVar52,auVar31);
        auVar43 = vfmsub213ps_fma(auVar45,local_1110,auVar72);
        auVar44 = vfmsub213ps_fma(auVar44,local_1130,auVar78);
        auVar31 = vandps_avx(auVar72,auVar67);
        auVar42 = vandps_avx(auVar78,auVar67);
        auVar31 = vcmpps_avx(auVar31,auVar42,1);
        local_1210 = vblendvps_avx(auVar44,auVar43,auVar31);
        auVar36._0_4_ = local_1210._0_4_ * local_13a0._4_4_;
        auVar36._4_4_ = local_1210._4_4_ * local_13a0._4_4_;
        auVar36._8_4_ = local_1210._8_4_ * local_13a0._4_4_;
        auVar36._12_4_ = local_1210._12_4_ * local_13a0._4_4_;
        auVar31 = vfmadd213ps_fma(auVar81,local_1220,auVar36);
        auVar31 = vfmadd213ps_fma(local_1390,local_1230,auVar31);
        auVar73._0_4_ = auVar31._0_4_ + auVar31._0_4_;
        auVar73._4_4_ = auVar31._4_4_ + auVar31._4_4_;
        auVar73._8_4_ = auVar31._8_4_ + auVar31._8_4_;
        auVar73._12_4_ = auVar31._12_4_ + auVar31._12_4_;
        auVar37._0_4_ = local_1210._0_4_ * fVar100;
        auVar37._4_4_ = local_1210._4_4_ * fVar102;
        auVar37._8_4_ = local_1210._8_4_ * fVar104;
        auVar37._12_4_ = local_1210._12_4_ * fVar106;
        auVar31 = vfmadd213ps_fma(local_1360,local_1220,auVar37);
        auVar42 = vfmadd213ps_fma(local_1350,local_1230,auVar31);
        auVar31 = vrcpps_avx(auVar73);
        auVar85._8_4_ = 0x3f800000;
        auVar85._0_8_ = 0x3f8000003f800000;
        auVar85._12_4_ = 0x3f800000;
        auVar43 = vfnmadd213ps_fma(auVar31,auVar73,auVar85);
        auVar31 = vfmadd132ps_fma(auVar43,auVar31,auVar31);
        local_1240._0_4_ = auVar31._0_4_ * (auVar42._0_4_ + auVar42._0_4_);
        local_1240._4_4_ = auVar31._4_4_ * (auVar42._4_4_ + auVar42._4_4_);
        local_1240._8_4_ = auVar31._8_4_ * (auVar42._8_4_ + auVar42._8_4_);
        local_1240._12_4_ = auVar31._12_4_ * (auVar42._12_4_ + auVar42._12_4_);
        auVar30 = ZEXT1664(local_1240);
        uVar10 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar38._4_4_ = uVar10;
        auVar38._0_4_ = uVar10;
        auVar38._8_4_ = uVar10;
        auVar38._12_4_ = uVar10;
        auVar31 = vcmpps_avx(auVar38,local_1240,2);
        uVar10 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar86._4_4_ = uVar10;
        auVar86._0_4_ = uVar10;
        auVar86._8_4_ = uVar10;
        auVar86._12_4_ = uVar10;
        auVar74 = ZEXT1664(auVar86);
        auVar42 = vcmpps_avx(local_1240,auVar86,2);
        auVar31 = vandps_avx(auVar31,auVar42);
        auVar42 = auVar32 & auVar31;
        if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar42[0xf] < '\0') {
          auVar42 = vandps_avx(auVar31,auVar32);
          auVar43 = vcmpps_avx(auVar73,_DAT_01f45a50,4);
          auVar44 = auVar43 & auVar42;
          if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar44[0xf] < '\0') {
            local_1330 = vandps_avx(auVar42,auVar43);
            local_1280 = &local_13a9;
            uStack_1338 = auVar32._8_8_;
            local_1340 = context->scene;
            auVar32 = vrcpps_avx(local_1290);
            auVar58._8_4_ = 0x3f800000;
            auVar58._0_8_ = 0x3f8000003f800000;
            auVar58._12_4_ = 0x3f800000;
            auVar42 = vfnmadd213ps_fma(local_1290,auVar32,auVar58);
            auVar42 = vfmadd132ps_fma(auVar42,auVar32,auVar32);
            auVar50._8_4_ = 0x219392ef;
            auVar50._0_8_ = 0x219392ef219392ef;
            auVar50._12_4_ = 0x219392ef;
            auVar32 = vcmpps_avx(local_1150,auVar50,5);
            auVar32 = vandps_avx(auVar42,auVar32);
            auVar27._0_4_ = local_12b0 * auVar32._0_4_;
            auVar27._4_4_ = fStack_12ac * auVar32._4_4_;
            auVar27._8_4_ = fStack_12a8 * auVar32._8_4_;
            auVar27._12_4_ = fStack_12a4 * auVar32._12_4_;
            local_1260 = vminps_avx(auVar27,auVar58);
            auVar28._0_4_ = local_12a0._0_4_ * auVar32._0_4_;
            auVar28._4_4_ = local_12a0._4_4_ * auVar32._4_4_;
            auVar28._8_4_ = local_12a0._8_4_ * auVar32._8_4_;
            auVar28._12_4_ = local_12a0._12_4_ * auVar32._12_4_;
            local_1250 = vminps_avx(auVar28,auVar58);
            auVar51._8_4_ = 0x7f800000;
            auVar51._0_8_ = 0x7f8000007f800000;
            auVar51._12_4_ = 0x7f800000;
            auVar32 = vblendvps_avx(auVar51,local_1240,local_1330);
            auVar42 = vshufps_avx(auVar32,auVar32,0xb1);
            auVar42 = vminps_avx(auVar42,auVar32);
            auVar43 = vshufpd_avx(auVar42,auVar42,1);
            auVar42 = vminps_avx(auVar43,auVar42);
            auVar32 = vcmpps_avx(auVar32,auVar42,0);
            auVar43 = local_1330 & auVar32;
            auVar42 = vpcmpeqd_avx(auVar42,auVar42);
            if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar43[0xf] < '\0') {
              auVar42 = auVar32;
            }
            lVar13 = lVar13 + uVar22;
            auVar32 = vandps_avx(local_1330,auVar42);
            uVar10 = vmovmskps_avx(auVar32);
            lVar14 = 0;
            for (uVar21 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar10); (uVar21 & 1) == 0;
                uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              lVar14 = lVar14 + 1;
            }
            auVar40 = vpcmpeqd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar31));
            auVar79 = ZEXT3264(auVar40);
            local_13a0 = lVar13;
            local_1270 = local_1330;
            do {
              uVar9 = *(uint *)(lVar13 + 0x90 + lVar14 * 4);
              uVar21 = (ulong)uVar9;
              lVar13 = *(long *)(*(long *)((long)local_1340 + 0x1e8) + uVar21 * 8);
              local_1390._0_8_ = lVar13;
              if ((*(uint *)(lVar13 + 0x34) & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1330 + lVar14 * 4) = 0;
                lVar13 = local_13a0;
              }
              else {
                local_1350._0_8_ = lVar14;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (*(long *)(lVar13 + 0x40) == 0)) {
                  uVar10 = *(undefined4 *)(local_1260 + lVar14 * 4);
                  uVar1 = *(undefined4 *)(local_1250 + lVar14 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1240 + lVar14 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1230 + lVar14 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1220 + lVar14 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_1210 + lVar14 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar10;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)(local_13a0 + 0xa0 + lVar14 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar9;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_1060 = *(undefined4 *)(local_1260 + lVar14 * 4);
                local_1040 = *(undefined4 *)(local_1250 + lVar14 * 4);
                uVar10 = *(undefined4 *)(local_13a0 + 0xa0 + lVar14 * 4);
                local_1020._4_4_ = uVar10;
                local_1020._0_4_ = uVar10;
                local_1020._8_4_ = uVar10;
                local_1020._12_4_ = uVar10;
                local_1020._16_4_ = uVar10;
                local_1020._20_4_ = uVar10;
                local_1020._24_4_ = uVar10;
                local_1020._28_4_ = uVar10;
                uVar10 = *(undefined4 *)(local_1230 + lVar14 * 4);
                uVar1 = *(undefined4 *)(local_1220 + lVar14 * 4);
                local_10a0._4_4_ = uVar1;
                local_10a0._0_4_ = uVar1;
                local_10a0._8_4_ = uVar1;
                local_10a0._12_4_ = uVar1;
                local_10a0._16_4_ = uVar1;
                local_10a0._20_4_ = uVar1;
                local_10a0._24_4_ = uVar1;
                local_10a0._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_1210 + lVar14 * 4);
                local_1080._4_4_ = uVar1;
                local_1080._0_4_ = uVar1;
                local_1080._8_4_ = uVar1;
                local_1080._12_4_ = uVar1;
                local_1080._16_4_ = uVar1;
                local_1080._20_4_ = uVar1;
                local_1080._24_4_ = uVar1;
                local_1080._28_4_ = uVar1;
                local_1000._4_4_ = uVar9;
                local_1000._0_4_ = uVar9;
                local_1000._8_4_ = uVar9;
                local_1000._12_4_ = uVar9;
                local_1000._16_4_ = uVar9;
                local_1000._20_4_ = uVar9;
                local_1000._24_4_ = uVar9;
                local_1000._28_4_ = uVar9;
                local_10c0[0] = (RTCHitN)(char)uVar10;
                local_10c0[1] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_10c0[2] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_10c0[3] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_10c0[4] = (RTCHitN)(char)uVar10;
                local_10c0[5] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_10c0[6] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_10c0[7] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_10c0[8] = (RTCHitN)(char)uVar10;
                local_10c0[9] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_10c0[10] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_10c0[0xb] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_10c0[0xc] = (RTCHitN)(char)uVar10;
                local_10c0[0xd] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_10c0[0xe] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_10c0[0xf] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_10c0[0x10] = (RTCHitN)(char)uVar10;
                local_10c0[0x11] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_10c0[0x14] = (RTCHitN)(char)uVar10;
                local_10c0[0x15] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_10c0[0x18] = (RTCHitN)(char)uVar10;
                local_10c0[0x19] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_10c0[0x1c] = (RTCHitN)(char)uVar10;
                local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                uStack_105c = local_1060;
                uStack_1058 = local_1060;
                uStack_1054 = local_1060;
                uStack_1050 = local_1060;
                uStack_104c = local_1060;
                uStack_1048 = local_1060;
                uStack_1044 = local_1060;
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1240 + lVar14 * 4);
                local_1200 = local_10e0;
                local_12f0.valid = (int *)local_1200;
                local_12f0.geometryUserPtr = *(void **)(lVar13 + 0x18);
                local_12f0.context = context->user;
                local_12f0.hit = local_10c0;
                local_12f0.N = 8;
                local_12f0.ray = (RTCRayN *)ray;
                if (*(code **)(lVar13 + 0x40) != (code *)0x0) {
                  local_1360._0_8_ = lVar16;
                  local_1370 = auVar30._0_16_;
                  local_1380 = auVar74._0_16_;
                  auVar40 = ZEXT1632(auVar79._0_16_);
                  (**(code **)(lVar13 + 0x40))(&local_12f0);
                  auVar74 = ZEXT1664(local_1380);
                  auVar30 = ZEXT1664(local_1370);
                  auVar40 = vpcmpeqd_avx2(auVar40,auVar40);
                  auVar79 = ZEXT3264(auVar40);
                  lVar16 = local_1360._0_8_;
                  uVar17 = local_13a8;
                  k = local_1310;
                  ray = local_1308;
                  uVar18 = local_1318;
                }
                auVar6 = vpcmpeqd_avx2(local_1200,_DAT_01f7b000);
                auVar40 = auVar79._0_32_ & ~auVar6;
                if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar40 >> 0x7f,0) == '\0') &&
                      (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar40 >> 0xbf,0) == '\0') &&
                    (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar40[0x1f]) {
                  auVar6 = auVar6 ^ auVar79._0_32_;
                }
                else {
                  p_Var4 = context->args->filter;
                  if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_1390._0_8_ + 0x3e) & 0x40) != 0)))) {
                    local_1360._0_8_ = lVar16;
                    local_1370 = auVar30._0_16_;
                    local_1380 = auVar74._0_16_;
                    auVar40 = ZEXT1632(auVar79._0_16_);
                    (*p_Var4)(&local_12f0);
                    auVar74 = ZEXT1664(local_1380);
                    auVar30 = ZEXT1664(local_1370);
                    auVar40 = vpcmpeqd_avx2(auVar40,auVar40);
                    auVar79 = ZEXT3264(auVar40);
                    lVar16 = local_1360._0_8_;
                    uVar17 = local_13a8;
                    k = local_1310;
                    ray = local_1308;
                    uVar18 = local_1318;
                  }
                  auVar5 = vpcmpeqd_avx2(local_1200,_DAT_01f7b000);
                  auVar6 = auVar5 ^ auVar79._0_32_;
                  auVar40 = auVar79._0_32_ & ~auVar5;
                  if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar40 >> 0x7f,0) != '\0') ||
                        (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar40 >> 0xbf,0) != '\0') ||
                      (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar40[0x1f] < '\0') {
                    auVar41._0_4_ = auVar5._0_4_ ^ auVar79._0_4_;
                    auVar41._4_4_ = auVar5._4_4_ ^ auVar79._4_4_;
                    auVar41._8_4_ = auVar5._8_4_ ^ auVar79._8_4_;
                    auVar41._12_4_ = auVar5._12_4_ ^ auVar79._12_4_;
                    auVar41._16_4_ = auVar5._16_4_ ^ auVar79._16_4_;
                    auVar41._20_4_ = auVar5._20_4_ ^ auVar79._20_4_;
                    auVar41._24_4_ = auVar5._24_4_ ^ auVar79._24_4_;
                    auVar41._28_4_ = auVar5._28_4_ ^ auVar79._28_4_;
                    auVar40 = vmaskmovps_avx(auVar41,*(undefined1 (*) [32])local_12f0.hit);
                    *(undefined1 (*) [32])(local_12f0.ray + 0x180) = auVar40;
                    auVar40 = vmaskmovps_avx(auVar41,*(undefined1 (*) [32])(local_12f0.hit + 0x20));
                    *(undefined1 (*) [32])(local_12f0.ray + 0x1a0) = auVar40;
                    auVar40 = vmaskmovps_avx(auVar41,*(undefined1 (*) [32])(local_12f0.hit + 0x40));
                    *(undefined1 (*) [32])(local_12f0.ray + 0x1c0) = auVar40;
                    auVar40 = vmaskmovps_avx(auVar41,*(undefined1 (*) [32])(local_12f0.hit + 0x60));
                    *(undefined1 (*) [32])(local_12f0.ray + 0x1e0) = auVar40;
                    auVar40 = vmaskmovps_avx(auVar41,*(undefined1 (*) [32])(local_12f0.hit + 0x80));
                    *(undefined1 (*) [32])(local_12f0.ray + 0x200) = auVar40;
                    auVar40 = vpmaskmovd_avx2(auVar41,*(undefined1 (*) [32])(local_12f0.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_12f0.ray + 0x220) = auVar40;
                    auVar40 = vpmaskmovd_avx2(auVar41,*(undefined1 (*) [32])(local_12f0.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_12f0.ray + 0x240) = auVar40;
                    auVar40 = vpmaskmovd_avx2(auVar41,*(undefined1 (*) [32])(local_12f0.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_12f0.ray + 0x260) = auVar40;
                    auVar40 = vpmaskmovd_avx2(auVar41,*(undefined1 (*) [32])(local_12f0.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_12f0.ray + 0x280) = auVar40;
                  }
                }
                if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar6 >> 0x7f,0) == '\0') &&
                      (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar6 >> 0xbf,0) == '\0') &&
                    (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar6[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar74._0_4_;
                }
                else {
                  auVar74 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_1330 + local_1350._0_8_ * 4) = 0;
                uVar10 = auVar74._0_4_;
                auVar29._4_4_ = uVar10;
                auVar29._0_4_ = uVar10;
                auVar29._8_4_ = uVar10;
                auVar29._12_4_ = uVar10;
                auVar32 = vcmpps_avx(auVar30._0_16_,auVar29,2);
                local_1330 = vandps_avx(auVar32,local_1330);
                uVar21 = local_1350._0_8_;
                lVar13 = local_13a0;
              }
              if ((((local_1330 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_1330 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_1330 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_1330[0xf]) break;
              auVar39._8_4_ = 0x7f800000;
              auVar39._0_8_ = 0x7f8000007f800000;
              auVar39._12_4_ = 0x7f800000;
              auVar32 = vblendvps_avx(auVar39,auVar30._0_16_,local_1330);
              auVar31 = vshufps_avx(auVar32,auVar32,0xb1);
              auVar31 = vminps_avx(auVar31,auVar32);
              auVar42 = vshufpd_avx(auVar31,auVar31,1);
              auVar31 = vminps_avx(auVar42,auVar31);
              auVar31 = vcmpps_avx(auVar32,auVar31,0);
              auVar42 = local_1330 & auVar31;
              auVar32 = local_1330;
              if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar42[0xf] < '\0') {
                auVar32 = vandps_avx(auVar31,local_1330);
              }
              uVar10 = vmovmskps_avx(auVar32);
              lVar14 = 0;
              for (uVar21 = CONCAT44((int)(uVar21 >> 0x20),uVar10); (uVar21 & 1) == 0;
                  uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                lVar14 = lVar14 + 1;
              }
            } while( true );
          }
        }
      }
      auVar79 = ZEXT1664(local_1160);
      auVar80 = ZEXT1664(local_1170);
      auVar82 = ZEXT1664(local_1180);
      auVar74 = ZEXT1664(local_12c0);
      fVar83 = local_1190;
      fVar87 = fStack_118c;
      fVar88 = fStack_1188;
      fVar89 = fStack_1184;
      fVar90 = local_11a0;
      fVar91 = fStack_119c;
      fVar92 = fStack_1198;
      fVar93 = fStack_1194;
      fVar94 = local_11b0;
      fVar100 = fStack_11ac;
      fVar102 = fStack_11a8;
      fVar104 = fStack_11a4;
      fVar95 = local_11c0;
      fVar106 = fStack_11bc;
      fVar97 = fStack_11b8;
      fVar98 = fStack_11b4;
      fVar99 = local_11d0;
      fVar101 = fStack_11cc;
      fVar103 = fStack_11c8;
      fVar105 = fStack_11c4;
      fVar107 = local_11e0;
      fVar108 = fStack_11dc;
      fVar109 = fStack_11d8;
      fVar110 = fStack_11d4;
    }
    uVar10 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar30 = ZEXT1664(CONCAT412(uVar10,CONCAT48(uVar10,CONCAT44(uVar10,uVar10))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }